

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O0

void __thiscall lambda::parse_from::helper::get_close_paren(helper *this)

{
  int iVar1;
  int iVar2;
  int_type ch;
  helper *this_local;
  
  eat_whitespace(this);
  iVar1 = std::istream::get();
  if ((iVar1 == 0x28) && (iVar2 = std::istream::peek(), iVar2 == 0x2a)) {
    std::istream::get();
    comment(this);
    get_close_paren(this);
    return;
  }
  if (iVar1 == 0x29) {
    std::istream::get();
    return;
  }
  unexpected_thing(this);
}

Assistant:

void get_close_paren() {
      eat_whitespace();
	  auto ch = inp.get();

      if (ch == '(' and inp.peek() == '*') {
        inp.get();
        comment();
        return get_close_paren();
      }

      if (ch == ')') {
        inp.get();
      } else {
        unexpected_thing();
      }
    }